

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_util.hpp
# Opt level: O0

bool scale_freqs(vector<unsigned_int,_std::allocator<unsigned_int>_> *S,
                vector<unsigned_long,_std::allocator<unsigned_long>_> *F,
                vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping,int64_t M,size_t sigma,
                size_t freq_sum)

{
  uint uVar1;
  value_type vVar2;
  reference pvVar3;
  const_reference pvVar4;
  long in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  ulong in_R8;
  long in_R9;
  undefined8 in_XMM0_Qa;
  double dVar5;
  undefined8 uVar9;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar12 [64];
  double ratio;
  double aratio;
  value_type mapped_sym;
  size_t cur_sym;
  double fratio;
  undefined8 local_40;
  undefined8 local_30;
  undefined8 local_20;
  undefined1 auVar8 [64];
  
  auVar6 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,in_R9);
  auVar12 = ZEXT1664(auVar6);
  dVar5 = (double)in_RCX / auVar6._0_8_;
  auVar8 = ZEXT1664(CONCAT88(in_XMM0_Qa,dVar5));
  local_40 = 0;
  local_30 = in_R9;
  local_20 = in_RCX;
  while( true ) {
    auVar6 = auVar12._0_16_;
    uVar9 = auVar8._8_8_;
    if (in_R8 <= local_40) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDX,local_40);
    uVar1 = *pvVar3;
    auVar6 = vcvtusi2sd_avx512f(auVar6,local_30);
    auVar6._0_8_ = (double)local_20 / auVar6._0_8_;
    auVar6._8_8_ = uVar9;
    vcvtusi2sd_avx512f(auVar6,in_R8 - local_40);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar5;
    vcvtusi2sd_avx512f(auVar10,in_R8);
    vcvtusi2sd_avx512f(auVar10,local_40);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = auVar6._0_8_;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RSI,(ulong)uVar1);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = auVar6._0_8_;
    auVar12 = ZEXT1664(auVar11);
    auVar6 = vcvtusi2sd_avx512f(auVar7,*pvVar4);
    auVar6 = vfmadd213sd_fma(auVar6,auVar11,ZEXT816(0x3fe0000000000000));
    auVar8 = ZEXT1664(auVar6);
    vVar2 = vcvttsd2usi_avx512f(auVar6);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(ulong)uVar1);
    *pvVar3 = vVar2;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(ulong)uVar1);
    if (*pvVar3 == 0) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI,(ulong)uVar1);
      *pvVar3 = 1;
    }
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(ulong)uVar1);
    local_20 = local_20 - (ulong)*pvVar3;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RSI,(ulong)uVar1);
    local_30 = local_30 - *pvVar4;
    if (local_20 < 0) break;
    local_40 = local_40 + 1;
  }
  return local_20 != 0;
}

Assistant:

bool scale_freqs(std::vector<uint32_t>& S, const std::vector<uint64_t>& F,
    std::vector<uint32_t>& mapping, int64_t M, size_t sigma, size_t freq_sum)
{
    double fratio = double(M) / double(freq_sum);
    for (size_t cur_sym = 0; cur_sym < sigma; cur_sym++) {
        auto mapped_sym = mapping[cur_sym];
        double aratio = double(M) / double(freq_sum);
        double ratio
            = (sigma - cur_sym) * fratio / sigma + cur_sym * aratio / sigma;
        S[mapped_sym] = (uint32_t)(0.5 + aratio * F[mapped_sym]);
        if (S[mapped_sym] == 0)
            S[mapped_sym] = 1;
        M -= S[mapped_sym];
        freq_sum -= F[mapped_sym];
        if (M < 0)
            break;
    }
    return M != 0;
}